

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O2

void endElementNsDebug(void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI)

{
  callbacks = callbacks + 1;
  if (noout != 0) {
    return;
  }
  fprintf(_stdout,"SAX.endElementNs(%s",localname);
  if (prefix == (xmlChar *)0x0) {
    fwrite(", NULL",6,1,_stdout);
  }
  else {
    fprintf(_stdout,", %s",prefix);
  }
  if (URI != (xmlChar *)0x0) {
    fprintf(_stdout,", \'%s\')\n",URI);
    return;
  }
  fwrite(", NULL)\n",8,1,_stdout);
  return;
}

Assistant:

static void
endElementNsDebug(void *ctx ATTRIBUTE_UNUSED,
                  const xmlChar *localname,
                  const xmlChar *prefix,
                  const xmlChar *URI)
{
    callbacks++;
    if (noout)
	return;
    fprintf(stdout, "SAX.endElementNs(%s", (char *) localname);
    if (prefix == NULL)
	fprintf(stdout, ", NULL");
    else
	fprintf(stdout, ", %s", (char *) prefix);
    if (URI == NULL)
	fprintf(stdout, ", NULL)\n");
    else
	fprintf(stdout, ", '%s')\n", (char *) URI);
}